

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_strauss_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  long in_RCX;
  code *in_R8;
  undefined8 in_R9;
  secp256k1_ge point;
  size_t scratch_checkpoint;
  size_t i;
  secp256k1_strauss_state state;
  secp256k1_scalar *scalars;
  secp256k1_gej *points;
  secp256k1_scalar *in_stack_000004f8;
  secp256k1_scalar *in_stack_00000500;
  secp256k1_gej *in_stack_00000508;
  size_t in_stack_00000510;
  secp256k1_gej *in_stack_00000518;
  secp256k1_strauss_state *in_stack_00000520;
  secp256k1_ge *in_stack_ffffffffffffff38;
  secp256k1_gej *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  secp256k1_scratch *in_stack_ffffffffffffff50;
  secp256k1_callback *in_stack_ffffffffffffff58;
  ulong local_68;
  int local_4;
  
  secp256k1_scratch_checkpoint
            ((secp256k1_callback *)in_stack_ffffffffffffff38,(secp256k1_scratch *)0x11f54c);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x11f55e);
  if ((in_RCX == 0) && (point.x.n[1] == 0)) {
    local_4 = 1;
  }
  else {
    pvVar2 = secp256k1_scratch_alloc
                       (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff48);
    pvVar3 = secp256k1_scratch_alloc
                       (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff48);
    pvVar4 = secp256k1_scratch_alloc
                       (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff48);
    pvVar5 = secp256k1_scratch_alloc
                       (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff48);
    pvVar6 = secp256k1_scratch_alloc
                       (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff48);
    if (((pvVar2 == (void *)0x0) ||
        (((pvVar3 == (void *)0x0 || (pvVar4 == (void *)0x0)) || (pvVar5 == (void *)0x0)))) ||
       (pvVar6 == (void *)0x0)) {
      secp256k1_scratch_apply_checkpoint
                ((secp256k1_callback *)in_stack_ffffffffffffff40,
                 (secp256k1_scratch *)in_stack_ffffffffffffff38,0x11f698);
      local_4 = 0;
    }
    else {
      for (local_68 = 0; local_68 < point.x.n[1]; local_68 = local_68 + 1) {
        iVar1 = (*in_R8)((void *)((long)pvVar3 + local_68 * 0x20),&stack0xffffffffffffff38,
                         local_68 + point.x.n[2],in_R9);
        if (iVar1 == 0) {
          secp256k1_scratch_apply_checkpoint
                    ((secp256k1_callback *)in_stack_ffffffffffffff40,
                     (secp256k1_scratch *)in_stack_ffffffffffffff38,0x11f719);
          return 0;
        }
        secp256k1_gej_set_ge(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
      secp256k1_ecmult_strauss_wnaf
                (in_stack_00000520,in_stack_00000518,in_stack_00000510,in_stack_00000508,
                 in_stack_00000500,in_stack_000004f8);
      secp256k1_scratch_apply_checkpoint
                ((secp256k1_callback *)in_stack_ffffffffffffff40,
                 (secp256k1_scratch *)in_stack_ffffffffffffff38,0x11f7a4);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_ecmult_strauss_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    secp256k1_gej* points;
    secp256k1_scalar* scalars;
    struct secp256k1_strauss_state state;
    size_t i;
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }

    /* We allocate STRAUSS_SCRATCH_OBJECTS objects on the scratch space. If these
     * allocations change, make sure to update the STRAUSS_SCRATCH_OBJECTS
     * constant and strauss_scratch_size accordingly. */
    points = (secp256k1_gej*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(secp256k1_gej));
    scalars = (secp256k1_scalar*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(secp256k1_scalar));
    state.aux = (secp256k1_fe*)secp256k1_scratch_alloc(error_callback, scratch, n_points * ECMULT_TABLE_SIZE(WINDOW_A) * sizeof(secp256k1_fe));
    state.pre_a = (secp256k1_ge*)secp256k1_scratch_alloc(error_callback, scratch, n_points * ECMULT_TABLE_SIZE(WINDOW_A) * sizeof(secp256k1_ge));
    state.ps = (struct secp256k1_strauss_point_state*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(struct secp256k1_strauss_point_state));

    if (points == NULL || scalars == NULL || state.aux == NULL || state.pre_a == NULL || state.ps == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    for (i = 0; i < n_points; i++) {
        secp256k1_ge point;
        if (!cb(&scalars[i], &point, i+cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        secp256k1_gej_set_ge(&points[i], &point);
    }
    secp256k1_ecmult_strauss_wnaf(&state, r, n_points, points, scalars, inp_g_sc);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}